

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkFragmentShadingRateAttachmentInfoKHR *create_info,ScratchAllocator *alloc)

{
  bool bVar1;
  VkAttachmentReference2 *pVVar2;
  VkAttachmentReference2 *att;
  VkFragmentShadingRateAttachmentInfoKHR *resolve;
  ScratchAllocator *alloc_local;
  VkFragmentShadingRateAttachmentInfoKHR *create_info_local;
  Impl *this_local;
  
  this_local = (Impl *)copy<VkFragmentShadingRateAttachmentInfoKHR>(this,create_info,1,alloc);
  if ((VkAttachmentReference2 *)(this_local->ycbcr_temp_allocator).impl !=
      (VkAttachmentReference2 *)0x0) {
    pVVar2 = copy<VkAttachmentReference2>
                       (this,(VkAttachmentReference2 *)(this_local->ycbcr_temp_allocator).impl,1,
                        alloc);
    bVar1 = copy_pnext_chain(this,pVVar2->pNext,alloc,&pVVar2->pNext,(DynamicStateInfo *)0x0,0);
    if (bVar1) {
      (this_local->ycbcr_temp_allocator).impl = (Impl *)pVVar2;
    }
    else {
      this_local = (Impl *)0x0;
    }
  }
  return this_local;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkFragmentShadingRateAttachmentInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *resolve = copy(create_info, 1, alloc);
	if (resolve->pFragmentShadingRateAttachment)
	{
		auto *att = copy(resolve->pFragmentShadingRateAttachment, 1, alloc);
		if (!copy_pnext_chain(att->pNext, alloc, &att->pNext, nullptr, 0))
			return nullptr;
		resolve->pFragmentShadingRateAttachment = att;
	}

	return resolve;
}